

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *iLimit;
  undefined8 *puVar1;
  seqDef *psVar2;
  bool bVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  U32 lowestValid;
  BYTE *pBVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong *puVar10;
  long lVar11;
  BYTE *pBVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  BYTE *pBVar21;
  ulong *puVar22;
  BYTE *litEnd;
  ulong *puVar23;
  ulong *puVar24;
  int iVar25;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_a0;
  uint local_98;
  uint local_94;
  ZSTD_matchState_t *local_90;
  seqStore_t *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  ulong *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong *local_50;
  long local_48;
  uint *local_40;
  BYTE *local_38;
  
  iLimit = (ulong *)((long)src + srcSize);
  pBVar21 = (ms->window).base;
  uVar20 = (ms->window).dictLimit;
  local_38 = pBVar21 + uVar20;
  uVar17 = (ms->cParams).minMatch;
  uVar18 = 6;
  if (uVar17 < 6) {
    uVar18 = uVar17;
  }
  uVar17 = 4;
  if (4 < uVar18) {
    uVar17 = uVar18;
  }
  local_54 = *rep;
  puVar23 = (ulong *)((ulong)((int)src == (int)local_38) + (long)src);
  iVar25 = (int)puVar23 - (int)pBVar21;
  uVar18 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_58 = iVar25 - uVar18;
  if (iVar25 - uVar20 <= uVar18) {
    local_58 = uVar20;
  }
  if (ms->loadedDictEnd != 0) {
    local_58 = uVar20;
  }
  local_5c = rep[1];
  local_58 = iVar25 - local_58;
  local_98 = local_5c;
  if (local_58 < local_5c) {
    local_98 = 0;
  }
  uVar20 = local_54;
  if (local_58 < local_54) {
    uVar20 = 0;
  }
  uVar19 = (ulong)uVar20;
  local_78 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_40 = rep;
  if (puVar23 < local_78) {
    puVar8 = (ulong *)((long)iLimit + -7);
    local_68 = (ulong *)((long)iLimit + -3);
    local_70 = (ulong *)((long)iLimit + -1);
    local_50 = iLimit + -4;
    local_90 = ms;
    local_88 = seqStore;
    local_80 = puVar8;
    do {
      local_94 = (uint)uVar19;
      local_48 = -uVar19;
      if (local_94 == 0) {
        pBVar21 = (BYTE *)0x0;
      }
      else {
        pBVar21 = (BYTE *)0x0;
        if (*(int *)(((long)puVar23 + 1) - uVar19) == *(int *)((long)puVar23 + 1)) {
          puVar22 = (ulong *)((long)puVar23 + 5);
          puVar9 = (ulong *)((long)puVar23 + local_48 + 5);
          puVar24 = puVar22;
          if (puVar22 < puVar8) {
            uVar14 = *puVar22 ^ *puVar9;
            uVar19 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
              }
            }
            pBVar21 = (BYTE *)(uVar19 >> 3 & 0x1fffffff);
            if (*puVar9 == *puVar22) {
              puVar24 = (ulong *)((long)puVar23 + 0xd);
              puVar9 = (ulong *)((long)puVar23 + local_48 + 0xd);
              do {
                if (puVar8 <= puVar24) goto LAB_00151d2d;
                uVar19 = *puVar9;
                uVar14 = *puVar24;
                uVar15 = uVar14 ^ uVar19;
                uVar13 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                pBVar21 = (BYTE *)((long)puVar24 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar22));
                puVar24 = puVar24 + 1;
                puVar9 = puVar9 + 1;
              } while (uVar19 == uVar14);
            }
          }
          else {
LAB_00151d2d:
            if ((puVar24 < local_68) && ((int)*puVar9 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar9 = (ulong *)((long)puVar9 + 4);
            }
            if ((puVar24 < local_70) && ((short)*puVar9 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar9 = (ulong *)((long)puVar9 + 2);
            }
            if (puVar24 < iLimit) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar24));
            }
            pBVar21 = (BYTE *)((long)puVar24 - (long)puVar22);
          }
          pBVar21 = pBVar21 + 4;
        }
      }
      local_a0 = 999999999;
      if (uVar17 == 6) {
        pBVar6 = (BYTE *)ZSTD_HcFindBestMatch_noDict_6
                                   (local_90,(BYTE *)puVar23,(BYTE *)iLimit,&local_a0);
      }
      else if (uVar17 == 5) {
        pBVar6 = (BYTE *)ZSTD_HcFindBestMatch_noDict_5
                                   (local_90,(BYTE *)puVar23,(BYTE *)iLimit,&local_a0);
      }
      else {
        pBVar6 = (BYTE *)ZSTD_HcFindBestMatch_noDict_4
                                   (local_90,(BYTE *)puVar23,(BYTE *)iLimit,&local_a0);
      }
      pBVar12 = pBVar21;
      if (pBVar21 < pBVar6) {
        pBVar12 = pBVar6;
      }
      if (pBVar12 < (BYTE *)0x4) {
        local_90->lazySkipping = (uint)(0x7ff < (ulong)((long)puVar23 - (long)src));
        uVar19 = (ulong)local_94;
        puVar8 = local_80;
        puVar23 = (ulong *)((long)puVar23 + ((ulong)((long)puVar23 - (long)src) >> 8) + 1);
        uVar18 = local_98;
      }
      else {
        puVar8 = puVar23;
        uVar14 = local_a0;
        if (pBVar6 <= pBVar21) {
          puVar8 = (ulong *)((long)puVar23 + 1);
          uVar14 = 1;
        }
        puVar22 = (ulong *)((long)puVar23 + local_48 + 0xd);
        do {
          if (local_78 <= puVar23) break;
          puVar24 = (ulong *)((long)puVar23 + 1);
          if (((uVar14 != 0) && (local_94 != 0)) &&
             (*(int *)puVar24 == *(int *)((long)puVar24 + local_48))) {
            puVar9 = (ulong *)((long)puVar23 + 5);
            puVar10 = (ulong *)((long)puVar23 + local_48 + 5);
            puVar7 = puVar9;
            if (puVar9 < local_80) {
              uVar13 = *puVar9 ^ *puVar10;
              uVar19 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              pBVar21 = (BYTE *)(uVar19 >> 3 & 0x1fffffff);
              if (*puVar10 == *puVar9) {
                puVar7 = (ulong *)((long)puVar23 + 0xd);
                puVar10 = puVar22;
                do {
                  if (local_80 <= puVar7) goto LAB_00151fc7;
                  uVar19 = *puVar10;
                  uVar13 = *puVar7;
                  uVar16 = uVar13 ^ uVar19;
                  uVar15 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  pBVar21 = (BYTE *)((long)puVar7 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar9));
                  puVar7 = puVar7 + 1;
                  puVar10 = puVar10 + 1;
                } while (uVar19 == uVar13);
              }
            }
            else {
LAB_00151fc7:
              if ((puVar7 < local_68) && ((int)*puVar10 == (int)*puVar7)) {
                puVar7 = (ulong *)((long)puVar7 + 4);
                puVar10 = (ulong *)((long)puVar10 + 4);
              }
              if ((puVar7 < local_70) && ((short)*puVar10 == (short)*puVar7)) {
                puVar7 = (ulong *)((long)puVar7 + 2);
                puVar10 = (ulong *)((long)puVar10 + 2);
              }
              if (puVar7 < iLimit) {
                puVar7 = (ulong *)((long)puVar7 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar7));
              }
              pBVar21 = (BYTE *)((long)puVar7 - (long)puVar9);
            }
            if (pBVar21 < (BYTE *)0xfffffffffffffffc) {
              uVar20 = 0x1f;
              if ((uint)uVar14 != 0) {
                for (; (uint)uVar14 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                }
              }
              if ((int)((uVar20 ^ 0x1f) + (int)pBVar12 * 3 + -0x1e) < (int)(pBVar21 + 4) * 3) {
                uVar14 = 1;
                pBVar12 = pBVar21 + 4;
                puVar8 = puVar24;
              }
            }
          }
          local_a0 = 999999999;
          if (uVar17 == 6) {
            pBVar21 = (BYTE *)ZSTD_HcFindBestMatch_noDict_6
                                        (local_90,(BYTE *)puVar24,(BYTE *)iLimit,&local_a0);
          }
          else if (uVar17 == 5) {
            pBVar21 = (BYTE *)ZSTD_HcFindBestMatch_noDict_5
                                        (local_90,(BYTE *)puVar24,(BYTE *)iLimit,&local_a0);
          }
          else {
            pBVar21 = (BYTE *)ZSTD_HcFindBestMatch_noDict_4
                                        (local_90,(BYTE *)puVar24,(BYTE *)iLimit,&local_a0);
          }
          bVar3 = true;
          if ((BYTE *)0x3 < pBVar21) {
            uVar20 = 0x1f;
            if ((uint)uVar14 != 0) {
              for (; (uint)uVar14 >> uVar20 == 0; uVar20 = uVar20 - 1) {
              }
            }
            iVar25 = 0x1f;
            if ((uint)local_a0 != 0) {
              for (; (uint)local_a0 >> iVar25 == 0; iVar25 = iVar25 + -1) {
              }
            }
            if ((int)((uVar20 ^ 0x1f) + (int)pBVar12 * 4 + -0x1b) < (int)pBVar21 * 4 - iVar25) {
              bVar3 = false;
              pBVar12 = pBVar21;
              uVar14 = local_a0;
              puVar8 = puVar24;
            }
          }
          puVar22 = (ulong *)((long)puVar22 + 1);
          puVar23 = puVar24;
        } while (!bVar3);
        uVar18 = local_98;
        uVar20 = local_94;
        if (3 < uVar14) {
          if ((src < puVar8) && (local_38 < (BYTE *)((long)puVar8 + (3 - uVar14)))) {
            puVar23 = puVar8;
            while (puVar8 = puVar23,
                  *(char *)((long)puVar23 - 1) == *(char *)((long)puVar23 + (2 - uVar14))) {
              puVar8 = (ulong *)((long)puVar23 - 1);
              pBVar12 = pBVar12 + 1;
              if ((puVar8 <= src) ||
                 (pBVar21 = (BYTE *)((long)puVar23 + (2 - uVar14)), puVar23 = puVar8,
                 pBVar21 <= local_38)) break;
            }
          }
          uVar18 = local_94;
          uVar20 = (U32)uVar14 - 3;
        }
        uVar19 = (ulong)uVar20;
        if (local_88->maxNbSeq <=
            (ulong)((long)local_88->sequences - (long)local_88->sequencesStart >> 3)) {
LAB_001524e0:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_88->maxNbLit) {
LAB_001524ff:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar13 = (long)puVar8 - (long)src;
        puVar23 = (ulong *)local_88->lit;
        if (local_88->litStart + local_88->maxNbLit < (BYTE *)((long)puVar23 + uVar13)) {
LAB_001524a2:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iLimit < puVar8) {
LAB_001524c1:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < puVar8) {
          ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)src,(BYTE *)puVar8,(BYTE *)local_50);
        }
        else {
          uVar15 = *(ulong *)((long)src + 8);
          *puVar23 = *src;
          puVar23[1] = uVar15;
          if (0x10 < uVar13) {
            pBVar21 = local_88->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar15 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar21 + 0x18) = uVar15;
            if (0x20 < (long)uVar13) {
              lVar11 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar11 + 0x20);
                uVar4 = puVar1[1];
                pBVar6 = pBVar21 + lVar11 + 0x20;
                *(undefined8 *)pBVar6 = *puVar1;
                *(undefined8 *)(pBVar6 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar11 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar6 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar6 + 0x18) = uVar4;
                lVar11 = lVar11 + 0x20;
              } while (pBVar6 + 0x20 < pBVar21 + uVar13);
            }
          }
        }
        local_88->lit = local_88->lit + uVar13;
        if (0xffff < uVar13) {
          if (local_88->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_88->longLengthType = ZSTD_llt_literalLength;
          local_88->longLengthPos =
               (U32)((ulong)((long)local_88->sequences - (long)local_88->sequencesStart) >> 3);
        }
        psVar2 = local_88->sequences;
        psVar2->litLength = (U16)uVar13;
        psVar2->offBase = (U32)uVar14;
        if (pBVar12 < (BYTE *)0x3) {
LAB_0015251e:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if ((BYTE *)0xffff < pBVar12 + -3) {
          if (local_88->longLengthType != ZSTD_llt_none) {
LAB_0015253d:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_88->longLengthType = ZSTD_llt_matchLength;
          local_88->longLengthPos =
               (U32)((ulong)((long)psVar2 - (long)local_88->sequencesStart) >> 3);
        }
        psVar2->mlBase = (U16)(pBVar12 + -3);
        local_88->sequences = psVar2 + 1;
        if (local_90->lazySkipping != 0) {
          local_90->lazySkipping = 0;
        }
        src = (void *)((long)puVar8 + (long)pBVar12);
        puVar8 = local_80;
        puVar23 = (ulong *)src;
        if ((uVar18 != 0) && (src <= local_78)) {
          while( true ) {
            psVar5 = local_88;
            uVar20 = (uint)uVar19;
            uVar14 = (ulong)uVar18;
            puVar23 = (ulong *)src;
            if ((int)*src != *(int *)((long)src - uVar14)) break;
            puVar23 = (ulong *)((long)src + 4);
            puVar24 = (ulong *)((long)src + (4 - uVar14));
            puVar22 = puVar23;
            if (puVar23 < puVar8) {
              uVar13 = *puVar23 ^ *puVar24;
              uVar19 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              pBVar21 = (BYTE *)(uVar19 >> 3 & 0x1fffffff);
              if (*puVar24 == *puVar23) {
                puVar22 = (ulong *)((long)src + 0xc);
                puVar24 = (ulong *)((long)src + (0xc - uVar14));
                do {
                  if (puVar8 <= puVar22) goto LAB_001522f4;
                  uVar19 = *puVar24;
                  uVar14 = *puVar22;
                  uVar15 = uVar14 ^ uVar19;
                  uVar13 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  pBVar21 = (BYTE *)((long)puVar22 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar23));
                  puVar22 = puVar22 + 1;
                  puVar24 = puVar24 + 1;
                } while (uVar19 == uVar14);
              }
            }
            else {
LAB_001522f4:
              if ((puVar22 < local_68) && ((int)*puVar24 == (int)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar22 < local_70) && ((short)*puVar24 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar22 < iLimit) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar22));
              }
              pBVar21 = (BYTE *)((long)puVar22 - (long)puVar23);
            }
            uVar19 = (ulong)uVar18;
            if (local_88->maxNbSeq <=
                (ulong)((long)local_88->sequences - (long)local_88->sequencesStart >> 3))
            goto LAB_001524e0;
            if (0x20000 < local_88->maxNbLit) goto LAB_001524ff;
            puVar23 = (ulong *)local_88->lit;
            if (local_88->litStart + local_88->maxNbLit < puVar23) goto LAB_001524a2;
            if (iLimit < src) goto LAB_001524c1;
            if (local_50 < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)src,(BYTE *)src,(BYTE *)local_50);
              puVar8 = local_80;
            }
            else {
              uVar14 = *(ulong *)((long)src + 8);
              *puVar23 = *src;
              puVar23[1] = uVar14;
            }
            psVar2 = psVar5->sequences;
            psVar2->litLength = 0;
            psVar2->offBase = 1;
            if (pBVar21 + 4 < (BYTE *)0x3) goto LAB_0015251e;
            if ((BYTE *)0xffff < pBVar21 + 1) {
              if (psVar5->longLengthType != ZSTD_llt_none) goto LAB_0015253d;
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar2 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar2->mlBase = (U16)(pBVar21 + 1);
            psVar5->sequences = psVar2 + 1;
            src = (void *)((long)src + (long)(pBVar21 + 4));
            puVar23 = (ulong *)src;
            uVar18 = uVar20;
            if ((uVar20 == 0) || (local_78 < src)) break;
          }
        }
      }
      uVar20 = (uint)uVar19;
      local_98 = uVar18;
    } while (puVar23 < local_78);
  }
  if (local_5c <= local_58) {
    local_5c = 0;
  }
  uVar17 = local_5c;
  if (uVar20 != 0) {
    uVar17 = local_54;
  }
  if (local_54 <= local_58) {
    uVar17 = local_5c;
    local_54 = 0;
  }
  if (uVar20 != 0) {
    local_54 = uVar20;
  }
  if (local_98 != 0) {
    uVar17 = local_98;
  }
  *local_40 = local_54;
  local_40[1] = uVar17;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_noDict);
}